

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_mla(DisasContext_conflict1 *s,arg_s_rrrr *a,_Bool add)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 pTVar1;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool add_local;
  arg_s_rrrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ret = load_reg(s,a->rn);
  pTVar1 = load_reg(s,a->rm);
  tcg_gen_mul_i32(tcg_ctx_00,ret,ret,pTVar1);
  tcg_temp_free_i32(tcg_ctx_00,pTVar1);
  if (add) {
    pTVar1 = load_reg(s,a->ra);
    tcg_gen_add_i32(tcg_ctx_00,ret,ret,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
  }
  if (a->s != 0) {
    gen_logic_CC(tcg_ctx_00,ret);
  }
  store_reg(s,a->rd,ret);
  return true;
}

Assistant:

static bool op_mla(DisasContext *s, arg_s_rrrr *a, bool add)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    tcg_gen_mul_i32(tcg_ctx, t1, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t2);
    if (add) {
        t2 = load_reg(s, a->ra);
        tcg_gen_add_i32(tcg_ctx, t1, t1, t2);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    if (a->s) {
        gen_logic_CC(tcg_ctx, t1);
    }
    store_reg(s, a->rd, t1);
    return true;
}